

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonEachOpenEach(sqlite3_vtab *p,sqlite3_vtab_cursor **ppCursor)

{
  int iVar1;
  sqlite3_vtab_cursor *psVar2;
  
  psVar2 = (sqlite3_vtab_cursor *)sqlite3DbMallocZero((sqlite3 *)p[1].pModule,0x108);
  if (psVar2 == (sqlite3_vtab_cursor *)0x0) {
    iVar1 = 7;
  }
  else {
    psVar2[6].pVtab = (sqlite3_vtab *)p[1].pModule;
    psVar2[8].pVtab = (sqlite3_vtab *)((long)&psVar2[0xb].pVtab + 2);
    psVar2[9].pVtab = (sqlite3_vtab *)0x64;
    psVar2[10].pVtab = (sqlite3_vtab *)0x0;
    *(undefined1 *)&psVar2[0xb].pVtab = 1;
    *ppCursor = psVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int jsonEachOpenEach(sqlite3_vtab *p, sqlite3_vtab_cursor **ppCursor){
  JsonEachConnection *pVtab = (JsonEachConnection*)p;
  JsonEachCursor *pCur;

  UNUSED_PARAMETER(p);
  pCur = sqlite3DbMallocZero(pVtab->db, sizeof(*pCur));
  if( pCur==0 ) return SQLITE_NOMEM;
  pCur->db = pVtab->db;
  jsonStringZero(&pCur->path);
  *ppCursor = &pCur->base;
  return SQLITE_OK;
}